

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O0

void ndn_pit_timeout(void *selfptr,size_t param_len,void *param)

{
  code *pcVar1;
  undefined8 uVar2;
  ndn_time_ms_t nVar3;
  void *userdata;
  ndn_on_timeout_func on_timeout;
  ndn_time_ms_t now;
  ndn_table_id_t i;
  ndn_pit_t *self;
  void *param_local;
  size_t param_len_local;
  void *selfptr_local;
  
  nVar3 = ndn_time_now_ms();
  for (now._6_2_ = 0; now._6_2_ < *(ushort *)((long)selfptr + 8); now._6_2_ = now._6_2_ + 1) {
    if (*(short *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x58) != -1) {
      if ((*(long *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x40) != 0) &&
         (*(ulong *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x10) <
          nVar3 - *(long *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x38))) {
        pcVar1 = *(code **)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x48);
        uVar2 = *(undefined8 *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x50);
        *(undefined8 *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x48) = 0;
        *(undefined8 *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x40) = 0;
        *(undefined8 *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x50) = 0;
        *(undefined8 *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x38) = 0;
        *(undefined8 *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x28) = 0;
        if (pcVar1 != (code *)0x0) {
          (*pcVar1)(uVar2);
        }
      }
      if ((*(ulong *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x30) < nVar3) &&
         (*(ulong *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x10) <
          nVar3 - *(long *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x30))) {
        ndn_pit_remove_entry
                  ((ndn_pit_t *)selfptr,
                   (ndn_pit_entry_t *)((long)selfptr + (ulong)now._6_2_ * 0x50 + 0x10));
      }
    }
  }
  ndn_msgqueue_post(selfptr,ndn_pit_timeout,0,(void *)0x0);
  return;
}

Assistant:

static void ndn_pit_timeout(void *selfptr, size_t param_len, void *param){
  ndn_pit_t* self = (ndn_pit_t*)selfptr;
  ndn_table_id_t i;
  ndn_time_ms_t now = ndn_time_now_ms();
  ndn_on_timeout_func on_timeout = NULL;
  void* userdata = NULL;

  for(i = 0; i < self->capacity; i ++){
    if(self->slots[i].nametree_id == NDN_INVALID_ID){
      continue;
    }

    // User timeout
    if(self->slots[i].on_data != NULL){
      if(now - self->slots[i].express_time > self->slots[i].options.lifetime){
        on_timeout = self->slots[i].on_timeout;
        userdata = self->slots[i].userdata;
        
        self->slots[i].on_timeout = NULL;
        self->slots[i].on_data = NULL;
        self->slots[i].userdata = NULL;
        self->slots[i].express_time = 0;
        self->slots[i].outgoing_faces = 0;

        if(on_timeout){
          on_timeout(userdata);
        }
      }
    }
    // PIT timeout
    if((now > self->slots[i].last_time) &&
       (now - self->slots[i].last_time > self->slots[i].options.lifetime))
    {
      ndn_pit_remove_entry(self, &self->slots[i]);
    }
  }

  ndn_msgqueue_post(self, ndn_pit_timeout, 0, NULL);
}